

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

RefractDataOut cert::refract_func(Vec3 *v,Vec3 *n,float ni_over_nt)

{
  double dVar1;
  RefractDataOut RVar2;
  float t;
  float fVar3;
  float fVar4;
  Vec3 VVar5;
  Vec3 VVar6;
  Vec3 VVar7;
  int local_48;
  undefined8 uStack_44;
  float local_28;
  float fStack_24;
  
  VVar5 = normalize(v);
  t = n->z * VVar5.z + n->x * VVar5.x + VVar5.y * n->y;
  fVar4 = 1.0 - (1.0 - t * t) * ni_over_nt * ni_over_nt;
  fVar3 = 0.0;
  if (fVar4 <= 0.0) {
    local_48 = (uint)local_48._1_3_ << 8;
    uStack_44 = 0;
  }
  else {
    local_48 = CONCAT31(local_48._1_3_,1);
    VVar6 = operator*(n,t);
    dVar1 = sqrt((double)(ulong)(uint)fVar4);
    VVar7 = operator*(n,SUB84(dVar1,0));
    local_28 = VVar6.x;
    fStack_24 = VVar6.y;
    fVar3 = (VVar5.z - VVar6.z) * ni_over_nt - VVar7.z;
    uStack_44 = CONCAT44(ni_over_nt * (VVar5.y - fStack_24) - VVar7.y,
                         ni_over_nt * (VVar5.x - local_28) - VVar7.x);
  }
  RVar2.refracted.x = (float)(undefined4)uStack_44;
  RVar2.refracted.y = (float)uStack_44._4_4_;
  RVar2._0_4_ = local_48;
  RVar2.refracted.z = fVar3;
  return RVar2;
}

Assistant:

constexpr RefractDataOut refract_func (Vec3 const& v, Vec3 const& n, float ni_over_nt)
{
	Vec3 uv = normalize (v);
	float dt = dot (uv, n);
	float discriminant = 1.0 - ni_over_nt * ni_over_nt * (1 - dt * dt);
	if (discriminant > 0)
	{
		return { true, ni_over_nt * (uv - n * dt) - n * sqrt (discriminant) };
	}
	else
		return { false };
}